

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall
Fossilize::StreamArchive::write_exported_metadata(StreamArchive *this,void *data_,size_t size)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  unordered_map<unsigned_long,_Fossilize::StreamArchive::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>_>
  *puVar4;
  ExportedMetadataBlock *block;
  value_type *blob;
  const_iterator __end3;
  const_iterator __begin3;
  unordered_map<unsigned_long,_Fossilize::StreamArchive::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>_>
  *__range3;
  ExportedMetadataBlock *pblocks;
  ExportedMetadataBlock *blocks;
  uint i_1;
  uint i;
  size_t offset;
  ExportedMetadataHeader *header;
  uint8_t *data;
  size_t size_local;
  void *data__local;
  StreamArchive *this_local;
  
  if (size < 0xb0) {
    this_local._7_1_ = false;
  }
  else {
    *(undefined8 *)data_ = 0xb10bf05511153;
    *(size_t *)((long)data_ + 8) = size;
    _i_1 = 0xb0;
    for (blocks._4_4_ = 0; blocks._4_4_ < 10; blocks._4_4_ = blocks._4_4_ + 1) {
      *(size_t *)((long)data_ + (ulong)blocks._4_4_ * 0x10 + 0x10) = _i_1;
      sVar2 = std::
              unordered_map<unsigned_long,_Fossilize::StreamArchive::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>_>
              ::size(this->seen_blobs + blocks._4_4_);
      *(size_type *)((long)data_ + (ulong)blocks._4_4_ * 0x10 + 0x18) = sVar2;
      _i_1 = *(long *)((long)data_ + (ulong)blocks._4_4_ * 0x10 + 0x18) * 0x20 + _i_1;
    }
    if (_i_1 == size) {
      for (blocks._0_4_ = 0; (uint)blocks < 10; blocks._0_4_ = (uint)blocks + 1) {
        puVar4 = (unordered_map<unsigned_long,_Fossilize::StreamArchive::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>_>
                  *)((long)data_ + *(long *)((long)data_ + (ulong)(uint)blocks * 0x10 + 0x10));
        __end3 = std::
                 unordered_map<unsigned_long,_Fossilize::StreamArchive::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>_>
                 ::begin(this->seen_blobs + (uint)blocks);
        blob = (value_type *)
               std::
               unordered_map<unsigned_long,_Fossilize::StreamArchive::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>_>
               ::end(this->seen_blobs + (uint)blocks);
        __range3 = puVar4;
        while( true ) {
          bVar1 = std::__detail::operator!=
                            (&__end3.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
                             ,(_Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
                               *)&blob);
          if (!bVar1) break;
          pvVar3 = std::__detail::
                   _Node_const_iterator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false,_false>
                   ::operator*(&__end3);
          (__range3->_M_h)._M_buckets = (__buckets_ptr)pvVar3->first;
          (__range3->_M_h)._M_bucket_count = (pvVar3->second).offset;
          (__range3->_M_h)._M_before_begin._M_nxt = *(_Hash_node_base **)&(pvVar3->second).header;
          (__range3->_M_h)._M_element_count = *(size_type *)&(pvVar3->second).header.crc;
          __range3 = (unordered_map<unsigned_long,_Fossilize::StreamArchive::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>_>
                      *)&(__range3->_M_h)._M_rehash_policy;
          std::__detail::
          _Node_const_iterator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false,_false>
          ::operator++(&__end3);
        }
        sVar2 = std::
                unordered_map<unsigned_long,_Fossilize::StreamArchive::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>_>
                ::size(this->seen_blobs + (uint)blocks);
        std::
        sort<Fossilize::ExportedMetadataBlock*,Fossilize::StreamArchive::write_exported_metadata(void*,unsigned_long)const::_lambda(Fossilize::ExportedMetadataBlock_const&,Fossilize::ExportedMetadataBlock_const&)_1_>
                  (puVar4,&(puVar4->_M_h)._M_buckets + sVar2 * 4);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool write_exported_metadata(void *data_, size_t size) const override
	{
		auto *data = static_cast<uint8_t *>(data_);
		auto *header = static_cast<ExportedMetadataHeader *>(data_);
		if (size < sizeof(*header))
			return false;

		header->magic = ExportedMetadataMagic;
		header->size = size;

		size_t offset = sizeof(*header);
		for (unsigned i = 0; i < RESOURCE_COUNT; i++)
		{
			header->lists[i].offset = offset;
			header->lists[i].count = seen_blobs[i].size();
			offset += header->lists[i].count * sizeof(ExportedMetadataBlock);
		}

		if (offset != size)
			return false;

		for (unsigned i = 0; i < RESOURCE_COUNT; i++)
		{
			auto *blocks = reinterpret_cast<ExportedMetadataBlock *>(data + header->lists[i].offset);
			auto *pblocks = blocks;

			for (auto &blob : seen_blobs[i])
			{
				auto &block = *pblocks;
				block.hash = blob.first;
				block.file_offset = blob.second.offset;
				block.payload = blob.second.header;
				pblocks++;
			}

			// Sorting here is somewhat important, since we will be using binary search when looking up exported metadata.
			// Conserving memory is also somewhat important, so we should only have one copy of the data structures we need
			// in immutable shared memory.
			// For hashmaps we would either need to make a completely custom SHM compatible hashmap implementation, which
			// would likely consume more memory either way.
			std::sort(blocks, blocks + seen_blobs[i].size(), [](const ExportedMetadataBlock &a, const ExportedMetadataBlock &b) {
				return a.hash < b.hash;
			});
		}

		return true;
	}